

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbox.cpp
# Opt level: O1

void __thiscall QToolBox::removeItem(QToolBox *this,int index)

{
  QToolBoxPrivate *this_00;
  QWidget *this_01;
  
  this_00 = *(QToolBoxPrivate **)&(this->super_QFrame).super_QWidget.field_0x8;
  this_01 = widget(this,index);
  if (this_01 != (QWidget *)0x0) {
    QObject::disconnect(&this_01->super_QObject,"2destroyed(QObject*)",(QObject *)this,
                        "1_q_widgetDestroyed(QObject*)");
    QWidget::setParent(this_01,(QWidget *)this);
    QToolBoxPrivate::_q_widgetDestroyed(this_00,&this_01->super_QObject);
    (**(code **)(*(long *)&(this->super_QFrame).super_QWidget + 0x1b0))(this,index);
    return;
  }
  return;
}

Assistant:

void QToolBox::removeItem(int index)
{
    Q_D(QToolBox);
    if (QWidget *w = widget(index)) {
        disconnect(w, SIGNAL(destroyed(QObject*)), this, SLOT(_q_widgetDestroyed(QObject*)));
        w->setParent(this);
        // destroy internal data
        d->_q_widgetDestroyed(w);
        itemRemoved(index);
    }
}